

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

void insert_embryo_category
               (embryonic_ui_entry *embryo,char *name,wchar_t psource_index,wchar_t priority,
               _Bool priority_set,wchar_t ind)

{
  wchar_t *pwVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  char **p;
  wchar_t wVar6;
  int iVar7;
  char **__dest;
  char *pcVar8;
  category_reference *pcVar9;
  ui_entry *puVar10;
  embryonic_category_reference *peVar11;
  wchar_t wVar12;
  long lVar13;
  long lVar14;
  wchar_t wVar15;
  ulong uVar16;
  long lVar17;
  
  __dest = categories;
  wVar12 = n_category;
  lVar17 = (long)n_category;
  uVar4 = (ulong)(uint)n_category;
  wVar15 = L'\0';
  while (uVar16 = uVar4, wVar6 = (wchar_t)uVar16, wVar15 != wVar6) {
    uVar4 = (long)(wVar15 + wVar6) / 2;
    wVar6 = (wchar_t)uVar4;
    iVar7 = strcmp(__dest[wVar6],name);
    if (iVar7 == 0) goto LAB_001d5505;
    uVar4 = uVar4 & 0xffffffff;
    if (iVar7 < 0) {
      uVar4 = uVar16;
      wVar15 = wVar6 + L'\x01';
    }
  }
  if (wVar12 == nalloc_category) {
    if (L'\x3fffffff' < wVar12) {
      quit("Too many categories");
      wVar12 = nalloc_category;
    }
    nalloc_category = L'\b';
    if (wVar12 != L'\0') {
      nalloc_category = wVar12 * 2;
    }
    __dest = (char **)mem_alloc((long)nalloc_category << 3);
    if (L'\0' < wVar6) {
      memcpy(__dest,categories,uVar16 << 3);
    }
    pcVar8 = string_make(name);
    __dest[wVar6] = pcVar8;
    p = categories;
    if (n_category - wVar6 != 0 && wVar6 <= n_category) {
      memcpy(__dest + (long)wVar6 + 1,categories + wVar6,(long)(n_category - wVar6) << 3);
    }
    mem_free(p);
    categories = __dest;
  }
  else {
    for (; wVar6 < lVar17; lVar17 = lVar17 + -1) {
      __dest[lVar17] = __dest[lVar17 + -1];
    }
    pcVar8 = string_make(name);
    __dest = categories;
    categories[wVar6] = pcVar8;
  }
  n_category = n_category + L'\x01';
LAB_001d5505:
  puVar10 = embryo->entry;
  wVar12 = puVar10->n_category;
  if (wVar12 == puVar10->nalloc_category) {
    if (L'\x3fffffff' < wVar12) {
      quit("Too many categories for an ui_entry");
      puVar10 = embryo->entry;
      wVar12 = puVar10->nalloc_category;
    }
    wVar15 = L'\x04';
    if (wVar12 != L'\0') {
      wVar15 = wVar12 * 2;
    }
    puVar10->nalloc_category = wVar15;
    if (embryo->exists == true) {
      pcVar9 = (category_reference *)mem_alloc((long)wVar15 << 4);
      if (L'\0' < ind) {
        memcpy(pcVar9,embryo->entry->categories,(ulong)(uint)ind << 4);
      }
      pcVar9[ind].name = categories[wVar6];
      pcVar9[ind].priority = priority;
      pcVar9[ind].priority_set = priority_set;
      puVar10 = embryo->entry;
      iVar7 = puVar10->n_category - ind;
      if (iVar7 != 0 && ind <= puVar10->n_category) {
        memcpy(pcVar9 + (long)ind + 1,puVar10->categories + ind,(long)iVar7 << 4);
        puVar10 = embryo->entry;
      }
      mem_free(puVar10->categories);
      embryo->entry->categories = pcVar9;
    }
    else {
      peVar11 = (embryonic_category_reference *)mem_alloc((long)wVar15 * 0x18);
      if (L'\0' < ind) {
        memcpy(peVar11,embryo->categories,(ulong)(uint)ind * 0x18);
      }
      peVar11[ind].name = categories[wVar6];
      peVar11[ind].psource_index = psource_index;
      peVar11[ind].priority = priority;
      peVar11[ind].priority_set = priority_set;
      wVar12 = embryo->entry->n_category;
      iVar7 = wVar12 - ind;
      if (iVar7 != 0 && ind <= wVar12) {
        memcpy(peVar11 + (long)ind + 1,embryo->categories + ind,(long)iVar7 * 0x18);
      }
      mem_free(embryo->categories);
      embryo->categories = peVar11;
    }
  }
  else {
    lVar17 = (long)wVar12;
    if (embryo->exists == true) {
      lVar13 = (long)ind;
      lVar14 = lVar17 << 4;
      for (; lVar13 < lVar17; lVar17 = lVar17 + -1) {
        pcVar9 = embryo->entry->categories;
        puVar3 = (undefined8 *)((long)&pcVar9[-1].name + lVar14);
        uVar5 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pcVar9->name + lVar14);
        *puVar2 = *puVar3;
        puVar2[1] = uVar5;
        lVar14 = lVar14 + -0x10;
      }
      pcVar9 = embryo->entry->categories;
      pcVar9[lVar13].name = __dest[wVar6];
      pcVar9[lVar13].priority = priority;
      pcVar9[lVar13].priority_set = priority_set;
    }
    else {
      lVar13 = (long)ind;
      lVar14 = lVar17 * 0x18;
      for (; lVar13 < lVar17; lVar17 = lVar17 + -1) {
        peVar11 = embryo->categories;
        *(undefined8 *)(&peVar11->priority_set + lVar14) =
             *(undefined8 *)((long)peVar11 + lVar14 + -8);
        puVar3 = (undefined8 *)((long)&peVar11[-1].name + lVar14);
        uVar5 = puVar3[1];
        puVar2 = (undefined8 *)((long)&peVar11->name + lVar14);
        *puVar2 = *puVar3;
        puVar2[1] = uVar5;
        lVar14 = lVar14 + -0x18;
      }
      peVar11 = embryo->categories;
      peVar11[lVar13].name = __dest[wVar6];
      peVar11[lVar13].psource_index = psource_index;
      peVar11[lVar13].priority = priority;
      peVar11[lVar13].priority_set = priority_set;
    }
  }
  pwVar1 = &embryo->entry->n_category;
  *pwVar1 = *pwVar1 + L'\x01';
  return;
}

Assistant:

static void insert_embryo_category(struct embryonic_ui_entry *embryo,
	const char *name, int psource_index, int priority, bool priority_set,
	int ind)
{
	int cind;

	if (! search_categories(name, &cind)) {
		if (n_category == nalloc_category) {
			char **extended;

			if (n_category > INT_MAX / 2) {
				quit("Too many categories");
			}
			nalloc_category = (nalloc_category == 0) ?
				8 : nalloc_category * 2;
			extended = mem_alloc(nalloc_category *
				sizeof(*extended));
			if (cind > 0) {
				memcpy(extended, categories,
					cind * sizeof(*extended));
			}
			extended[cind] = string_make(name);
			if (cind < n_category) {
				memcpy(extended + cind + 1, categories + cind,
					(n_category - cind) *
					sizeof(*extended));
			}
			mem_free(categories);
			categories = extended;
		} else {
			int i;

			for (i = n_category; i > cind; --i) {
				categories[i] = categories[i - 1];
			}
			categories[cind] = string_make(name);
		}
		++n_category;
	}
	if (embryo->entry->n_category == embryo->entry->nalloc_category) {
		if (embryo->entry->nalloc_category > INT_MAX / 2) {
			quit("Too many categories for an ui_entry");
		}
		embryo->entry->nalloc_category =
			(embryo->entry->nalloc_category == 0) ?
			4 : 2 * embryo->entry->nalloc_category;
		if (embryo->exists) {
			struct category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->entry->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->entry->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->entry->categories);
			embryo->entry->categories = extended;
		} else {
			struct embryonic_category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].psource_index = psource_index;
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->categories);
			embryo->categories = extended;
		}
	} else {
		int i;

		if (embryo->exists) {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->entry->categories[i] =
					embryo->entry->categories[i - 1];
			}
			embryo->entry->categories[ind].name = categories[cind];
			embryo->entry->categories[ind].priority = priority;
			embryo->entry->categories[ind].priority_set =
				priority_set;
		} else {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->categories[i] =
					embryo->categories[i - 1];
			}
			embryo->categories[ind].name = categories[cind];
			embryo->categories[ind].psource_index = psource_index;
			embryo->categories[ind].priority = priority;
			embryo->categories[ind].priority_set = priority_set;
		}
	}
	++embryo->entry->n_category;
}